

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O0

UChar32 __thiscall icu_63::CaseFoldingUTextIterator::next(CaseFoldingUTextIterator *this)

{
  UChar UVar1;
  int iVar2;
  UChar *pUVar3;
  int32_t iVar4;
  uint local_34;
  uint uStack_1c;
  uint16_t __c2;
  UChar32 originalC;
  UChar32 foldedC;
  CaseFoldingUTextIterator *this_local;
  
  if (this->fFoldChars == (UChar *)0x0) {
    if ((this->fUText->chunkOffset < this->fUText->chunkLength) &&
       ((ushort)this->fUText->chunkContents[this->fUText->chunkOffset] < 0xd800)) {
      pUVar3 = this->fUText->chunkContents;
      iVar2 = this->fUText->chunkOffset;
      this->fUText->chunkOffset = iVar2 + 1;
      local_34 = (uint)(ushort)pUVar3[iVar2];
    }
    else {
      local_34 = utext_next32_63(this->fUText);
    }
    if (local_34 == 0xffffffff) {
      return -1;
    }
    iVar4 = ucase_toFullFolding_63(local_34,&this->fFoldChars,0);
    this->fFoldLength = iVar4;
    if ((0x1e < this->fFoldLength) || (this->fFoldLength < 0)) {
      if (this->fFoldLength < 0) {
        this->fFoldLength = this->fFoldLength ^ 0xffffffff;
      }
      this->fFoldChars = (UChar *)0x0;
      return this->fFoldLength;
    }
    this->fFoldIndex = 0;
  }
  iVar2 = this->fFoldIndex;
  this->fFoldIndex = iVar2 + 1;
  uStack_1c = (uint)(ushort)this->fFoldChars[iVar2];
  if ((((uStack_1c & 0xfffffc00) == 0xd800) && (this->fFoldIndex != this->fFoldLength)) &&
     (UVar1 = this->fFoldChars[this->fFoldIndex], (UVar1 & 0xfc00U) == 0xdc00)) {
    this->fFoldIndex = this->fFoldIndex + 1;
    uStack_1c = uStack_1c * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
  }
  if (this->fFoldLength <= this->fFoldIndex) {
    this->fFoldChars = (UChar *)0x0;
  }
  return uStack_1c;
}

Assistant:

UChar32 CaseFoldingUTextIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        originalC = UTEXT_NEXT32(&fUText);
        if (originalC == U_SENTINEL) {
            return originalC;
        }
        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}